

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O1

uint * str_to_vector(uchar *s,uint s_len)

{
  uint *puVar1;
  ulong uVar2;
  
  puVar1 = (uint *)calloc((ulong)s_len,4);
  if (s_len != 0) {
    uVar2 = 0;
    do {
      puVar1[uVar2] = (uint)s[uVar2];
      uVar2 = uVar2 + 1;
    } while (s_len != uVar2);
  }
  return puVar1;
}

Assistant:

uint32_t *str_to_vector(uint8_t *s, uint32_t s_len)
{
    uint32_t *v = vector_new(s_len);
    for (uint32_t i = 0; i < s_len; i++)
        v[i] = ((uint32_t)s[i] < 0) ? 256 + s[i] : s[i];
    return v;
}